

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

void __thiscall SqlGenerator::generateLmfaoQuery(SqlGenerator *this)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer ppVar5;
  char cVar6;
  bool bVar7;
  size_t sVar8;
  View *pVVar9;
  TDNode *pTVar10;
  Attribute *pAVar11;
  pointer ppAVar12;
  undefined8 *puVar13;
  long *plVar14;
  ulong uVar15;
  char *pcVar16;
  size_type *psVar17;
  ulong *puVar18;
  ulong uVar19;
  long *plVar20;
  undefined8 *puVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  size_t i;
  Aggregate *pAVar23;
  undefined8 uVar24;
  char cVar25;
  ulong uVar26;
  var_bitset *this_00;
  long lVar27;
  long lVar28;
  string viewAgg;
  string agg;
  string localAgg;
  string __str_1;
  string __str_2;
  string aggregateString;
  string fvars;
  string returnString;
  ofstream ofs;
  char *local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  undefined8 *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  string local_348;
  ulong *local_328;
  uint local_320;
  undefined4 uStack_31c;
  ulong local_318 [2];
  ulong local_308;
  ulong *local_300;
  uint local_2f8;
  undefined4 uStack_2f4;
  ulong local_2f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  View *local_280;
  ulong local_278;
  char *local_270;
  long local_268;
  char local_260 [16];
  SqlGenerator *local_250;
  Aggregate *local_248;
  size_t local_240;
  ulong local_238;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  local_308 = 0;
  local_250 = this;
  do {
    sVar8 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar8 <= local_308) {
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_2a0);
      std::ofstream::ofstream(local_230,(string *)&local_2a0,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,local_270,local_268);
      std::ofstream::close();
      local_230._0_8_ = _VTT;
      *(undefined8 *)(local_230 + _VTT[-3]) = _error_with_option_name;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      if (local_270 != local_260) {
        operator_delete(local_270);
      }
      return;
    }
    pVVar9 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_308);
    pTVar10 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar9->_origin);
    uVar2 = pVVar9->_origin;
    uVar1 = pVVar9->_destination;
    local_240 = pTVar10->_numOfNeighbors;
    local_280 = pVVar9;
    sVar8 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    local_2a0._M_dataplus._M_p = local_2a0._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_230,sVar8,(bool *)&local_2a0,
               (allocator_type *)local_2c0);
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
    local_240 = local_240 - (uVar2 != uVar1);
    this_00 = &local_280->_fVars;
    sVar8 = 0;
    do {
      bVar7 = std::bitset<100UL>::test(this_00,sVar8);
      if (bVar7) {
        pAVar11 = TreeDecomposition::getAttribute
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,sVar8);
        local_2c0[0] = local_2b0;
        pcVar3 = (pAVar11->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,pcVar3,pcVar3 + (pAVar11->_name)._M_string_length);
        std::__cxx11::string::append((char *)local_2c0);
        std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0[0]);
        if (local_2c0[0] != local_2b0) {
          operator_delete(local_2c0[0]);
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != 100);
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
    ppAVar12 = (local_280->_aggregates).
               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((local_280->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppAVar12) {
      uVar26 = 0;
      do {
        pAVar23 = ppAVar12[uVar26];
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        local_278 = uVar26;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8);
        if ((pAVar23->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pAVar23->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar26 = 0;
          lVar27 = 0;
          local_248 = pAVar23;
          do {
            local_3a8 = &local_398;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
            pbVar4 = (pAVar23->_agg).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            sVar8 = 0;
            local_238 = uVar26;
            do {
              bVar7 = std::bitset<1500UL>::test(pbVar4 + uVar26,sVar8);
              if (bVar7) {
                getFunctionString_abi_cxx11_(&local_348,local_250,sVar8);
                puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
                local_3e8 = (char *)&local_3d8;
                pcVar16 = (char *)(puVar13 + 2);
                if ((char *)*puVar13 == pcVar16) {
                  local_3d8 = *(undefined8 *)pcVar16;
                  uStack_3d0 = puVar13[3];
                }
                else {
                  local_3d8 = *(undefined8 *)pcVar16;
                  local_3e8 = (char *)*puVar13;
                }
                local_3e0 = puVar13[1];
                *puVar13 = pcVar16;
                puVar13[1] = 0;
                *(undefined1 *)(puVar13 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_3e8);
                if (local_3e8 != (char *)&local_3d8) {
                  operator_delete(local_3e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p);
                }
              }
              sVar8 = sVar8 + 1;
            } while (sVar8 != 0x5dc);
            std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_3a8);
            local_3e8 = (char *)&local_3d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
            pAVar23 = local_248;
            lVar28 = lVar27;
            if (local_240 != 0) {
              lVar28 = local_240 + lVar27;
              do {
                ppVar5 = (pAVar23->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar26 = ppVar5[lVar27].first;
                cVar25 = '\x01';
                if (9 < uVar26) {
                  uVar15 = uVar26;
                  cVar6 = '\x04';
                  do {
                    cVar25 = cVar6;
                    if (uVar15 < 100) {
                      cVar25 = cVar25 + -2;
                      goto LAB_00296580;
                    }
                    if (uVar15 < 1000) {
                      cVar25 = cVar25 + -1;
                      goto LAB_00296580;
                    }
                    if (uVar15 < 10000) goto LAB_00296580;
                    bVar7 = 99999 < uVar15;
                    uVar15 = uVar15 / 10000;
                    cVar6 = cVar25 + '\x04';
                  } while (bVar7);
                  cVar25 = cVar25 + '\x01';
                }
LAB_00296580:
                uVar15 = ppVar5[lVar27].second;
                local_328 = local_318;
                std::__cxx11::string::_M_construct((ulong)&local_328,cVar25);
                std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_328,local_320,uVar26)
                ;
                plVar14 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_328,0,(char *)0x0,0x2b1b4b);
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                psVar17 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar17) {
                  local_2e0.field_2._M_allocated_capacity = *psVar17;
                  local_2e0.field_2._8_8_ = plVar14[3];
                }
                else {
                  local_2e0.field_2._M_allocated_capacity = *psVar17;
                  local_2e0._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_2e0._M_string_length = plVar14[1];
                *plVar14 = (long)psVar17;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e0);
                local_388 = &local_378;
                puVar18 = (ulong *)(plVar14 + 2);
                if ((ulong *)*plVar14 == puVar18) {
                  local_378 = *puVar18;
                  lStack_370 = plVar14[3];
                }
                else {
                  local_378 = *puVar18;
                  local_388 = (ulong *)*plVar14;
                }
                local_380 = plVar14[1];
                *plVar14 = (long)puVar18;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                cVar25 = '\x01';
                if (9 < uVar15) {
                  uVar19 = uVar15;
                  cVar6 = '\x04';
                  do {
                    cVar25 = cVar6;
                    if (uVar19 < 100) {
                      cVar25 = cVar25 + -2;
                      goto LAB_002966e6;
                    }
                    if (uVar19 < 1000) {
                      cVar25 = cVar25 + -1;
                      goto LAB_002966e6;
                    }
                    if (uVar19 < 10000) goto LAB_002966e6;
                    bVar7 = 99999 < uVar19;
                    uVar19 = uVar19 / 10000;
                    cVar6 = cVar25 + '\x04';
                  } while (bVar7);
                  cVar25 = cVar25 + '\x01';
                }
LAB_002966e6:
                local_300 = local_2f0;
                std::__cxx11::string::_M_construct((ulong)&local_300,cVar25);
                std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_300,local_2f8,uVar15)
                ;
                pAVar23 = local_248;
                uVar15 = 0xf;
                if (local_388 != &local_378) {
                  uVar15 = local_378;
                }
                uVar19 = CONCAT44(uStack_2f4,local_2f8) + local_380;
                if (uVar15 < uVar19) {
                  uVar15 = 0xf;
                  if (local_300 != local_2f0) {
                    uVar15 = local_2f0[0];
                  }
                  if (uVar15 < uVar19) goto LAB_0029677c;
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_300,0,(char *)0x0,(ulong)local_388);
                }
                else {
LAB_0029677c:
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_300);
                }
                local_368 = &local_358;
                puVar21 = puVar13 + 2;
                if ((undefined8 *)*puVar13 == puVar21) {
                  local_358 = *puVar21;
                  uStack_350 = puVar13[3];
                }
                else {
                  local_358 = *puVar21;
                  local_368 = (undefined8 *)*puVar13;
                }
                local_360 = puVar13[1];
                *puVar13 = puVar21;
                puVar13[1] = 0;
                *(undefined1 *)puVar21 = 0;
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_368);
                local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                puVar18 = (ulong *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar18) {
                  local_348.field_2._M_allocated_capacity = *puVar18;
                  local_348.field_2._8_8_ = plVar14[3];
                }
                else {
                  local_348.field_2._M_allocated_capacity = *puVar18;
                  local_348._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_348._M_string_length = plVar14[1];
                *plVar14 = (long)puVar18;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_3e8,(ulong)local_348._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p);
                }
                if (local_368 != &local_358) {
                  operator_delete(local_368);
                }
                if (local_300 != local_2f0) {
                  operator_delete(local_300);
                }
                if (local_388 != &local_378) {
                  operator_delete(local_388);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p);
                }
                if (local_328 != local_318) {
                  operator_delete(local_328);
                }
                uVar15 = uVar26 + 0x3f;
                if (-1 < (long)uVar26) {
                  uVar15 = uVar26;
                }
                *(ulong *)(local_230._0_8_ +
                          (((long)uVar15 >> 6) +
                          ((ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                     *(ulong *)(local_230._0_8_ +
                               (((long)uVar15 >> 6) +
                               ((ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) - 1)) *
                               8) | 1L << ((byte)uVar26 & 0x3f);
                lVar27 = lVar27 + 1;
              } while (lVar27 != lVar28);
            }
            std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_3e8);
            uVar26 = local_238;
            if (local_3c8._M_string_length != 0) {
              std::__cxx11::string::pop_back();
              std::__cxx11::string::append((char *)&local_3c8);
            }
            if (local_3e8 != (char *)&local_3d8) {
              operator_delete(local_3e8);
            }
            if (local_3a8 != &local_398) {
              operator_delete(local_3a8);
            }
            uVar26 = uVar26 + 1;
            lVar27 = lVar28;
          } while (uVar26 < (ulong)(((long)(pAVar23->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pAVar23->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                   -0x5555555555555555));
        }
        paVar22 = &local_348.field_2;
        if (local_3c8._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_3c8,0,(char *)0x0,0x2b1395);
        }
        else {
          std::__cxx11::string::pop_back();
        }
        std::operator+(&local_2e0,"\nSUM(",&local_3c8);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        this = local_250;
        local_388 = &local_378;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_378 = *puVar18;
          lStack_370 = puVar13[3];
        }
        else {
          local_378 = *puVar18;
          local_388 = (ulong *)*puVar13;
        }
        local_380 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        cVar25 = '\x01';
        if (9 < local_308) {
          uVar26 = local_308;
          cVar6 = '\x04';
          do {
            cVar25 = cVar6;
            if (uVar26 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_00296b03;
            }
            if (uVar26 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_00296b03;
            }
            if (uVar26 < 10000) goto LAB_00296b03;
            bVar7 = 99999 < uVar26;
            uVar26 = uVar26 / 10000;
            cVar6 = cVar25 + '\x04';
          } while (bVar7);
          cVar25 = cVar25 + '\x01';
        }
LAB_00296b03:
        local_328 = local_318;
        std::__cxx11::string::_M_construct((ulong)&local_328,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_328,local_320,local_308);
        uVar26 = 0xf;
        if (local_388 != &local_378) {
          uVar26 = local_378;
        }
        uVar15 = CONCAT44(uStack_31c,local_320) + local_380;
        if (uVar26 < uVar15) {
          uVar26 = 0xf;
          if (local_328 != local_318) {
            uVar26 = local_318[0];
          }
          if (uVar26 < uVar15) goto LAB_00296b96;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_388);
        }
        else {
LAB_00296b96:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_328);
        }
        puVar21 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar21) {
          local_358 = *puVar21;
          uStack_350 = puVar13[3];
          local_368 = &local_358;
        }
        else {
          local_358 = *puVar21;
          local_368 = (undefined8 *)*puVar13;
        }
        local_360 = puVar13[1];
        *puVar13 = puVar21;
        puVar13[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_348.field_2._M_allocated_capacity = *puVar18;
          local_348.field_2._8_8_ = puVar13[3];
          local_348._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_348.field_2._M_allocated_capacity = *puVar18;
          local_348._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_348._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        cVar25 = '\x01';
        if (9 < local_278) {
          uVar26 = local_278;
          cVar6 = '\x04';
          do {
            cVar25 = cVar6;
            if (uVar26 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_00296cc6;
            }
            if (uVar26 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_00296cc6;
            }
            if (uVar26 < 10000) goto LAB_00296cc6;
            bVar7 = 99999 < uVar26;
            uVar26 = uVar26 / 10000;
            cVar6 = cVar25 + '\x04';
          } while (bVar7);
          cVar25 = cVar25 + '\x01';
        }
LAB_00296cc6:
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct((ulong)&local_300,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_300,local_2f8,local_278);
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar22) {
          uVar24 = local_348.field_2._M_allocated_capacity;
        }
        uVar26 = CONCAT44(uStack_2f4,local_2f8) + local_348._M_string_length;
        if ((ulong)uVar24 < uVar26) {
          uVar15 = 0xf;
          if (local_300 != local_2f0) {
            uVar15 = local_2f0[0];
          }
          if (uVar15 < uVar26) goto LAB_00296d5d;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_300,0,(char *)0x0,(ulong)local_348._M_dataplus._M_p);
        }
        else {
LAB_00296d5d:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_300);
        }
        local_3e8 = (char *)&local_3d8;
        pcVar16 = (char *)(puVar13 + 2);
        if ((char *)*puVar13 == pcVar16) {
          local_3d8 = *(undefined8 *)pcVar16;
          uStack_3d0 = puVar13[3];
        }
        else {
          local_3d8 = *(undefined8 *)pcVar16;
          local_3e8 = (char *)*puVar13;
        }
        local_3e0 = puVar13[1];
        *puVar13 = pcVar16;
        puVar13[1] = 0;
        *pcVar16 = '\0';
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_3e8);
        local_3a8 = &local_398;
        plVar20 = plVar14 + 2;
        if ((long *)*plVar14 == plVar20) {
          local_398 = *plVar20;
          lStack_390 = plVar14[3];
        }
        else {
          local_398 = *plVar20;
          local_3a8 = (long *)*plVar14;
        }
        local_3a0 = plVar14[1];
        *plVar14 = (long)plVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_2c0,(ulong)local_3a8);
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
        if (local_3e8 != (char *)&local_3d8) {
          operator_delete(local_3e8);
        }
        if (local_300 != local_2f0) {
          operator_delete(local_300);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar22) {
          operator_delete(local_348._M_dataplus._M_p);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368);
        }
        if (local_328 != local_318) {
          operator_delete(local_328);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        uVar26 = local_278 + 1;
        ppAVar12 = (local_280->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar26 < (ulong)((long)(local_280->_aggregates).
                                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar12 >>
                               3));
    }
    std::__cxx11::string::pop_back();
    cVar25 = '\x01';
    if (9 < local_308) {
      uVar26 = local_308;
      cVar6 = '\x04';
      do {
        cVar25 = cVar6;
        if (uVar26 < 100) {
          cVar25 = cVar25 + -2;
          goto LAB_00296f87;
        }
        if (uVar26 < 1000) {
          cVar25 = cVar25 + -1;
          goto LAB_00296f87;
        }
        if (uVar26 < 10000) goto LAB_00296f87;
        bVar7 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar6 = cVar25 + '\x04';
      } while (bVar7);
      cVar25 = cVar25 + '\x01';
    }
LAB_00296f87:
    local_328 = local_318;
    std::__cxx11::string::_M_construct((ulong)&local_328,cVar25);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_328,local_320,local_308);
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,0x2b1a5c);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    psVar17 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_2e0.field_2._M_allocated_capacity = *psVar17;
      local_2e0.field_2._8_8_ = puVar13[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *psVar17;
      local_2e0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_2e0._M_string_length = puVar13[1];
    *puVar13 = psVar17;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
    local_388 = &local_378;
    puVar18 = puVar13 + 2;
    if ((ulong *)*puVar13 == puVar18) {
      local_378 = *puVar18;
      lStack_370 = puVar13[3];
    }
    else {
      local_378 = *puVar18;
      local_388 = (ulong *)*puVar13;
    }
    local_380 = puVar13[1];
    *puVar13 = puVar18;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2a0._M_dataplus._M_p);
    puVar21 = puVar13 + 2;
    if ((undefined8 *)*puVar13 == puVar21) {
      local_358 = *puVar21;
      uStack_350 = puVar13[3];
      local_368 = &local_358;
    }
    else {
      local_358 = *puVar21;
      local_368 = (undefined8 *)*puVar13;
    }
    local_360 = puVar13[1];
    *puVar13 = puVar21;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_2c0[0]);
    puVar18 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_348.field_2._M_allocated_capacity = *puVar18;
      local_348.field_2._8_8_ = puVar13[3];
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    }
    else {
      local_348.field_2._M_allocated_capacity = *puVar18;
      local_348._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_348._M_string_length = puVar13[1];
    *puVar13 = puVar18;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
    local_3e8 = (char *)&local_3d8;
    pcVar16 = (char *)(puVar13 + 2);
    if ((char *)*puVar13 == pcVar16) {
      local_3d8 = *(undefined8 *)pcVar16;
      uStack_3d0 = puVar13[3];
    }
    else {
      local_3d8 = *(undefined8 *)pcVar16;
      local_3e8 = (char *)*puVar13;
    }
    local_3e0 = puVar13[1];
    *puVar13 = pcVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    pTVar10 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)local_280->_origin);
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_3e8,(ulong)(pTVar10->_name)._M_dataplus._M_p);
    local_3a8 = &local_398;
    plVar14 = puVar13 + 2;
    if ((long *)*puVar13 == plVar14) {
      local_398 = *plVar14;
      lStack_390 = puVar13[3];
    }
    else {
      local_398 = *plVar14;
      local_3a8 = (long *)*puVar13;
    }
    local_3a0 = puVar13[1];
    *puVar13 = plVar14;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_3a8);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3c8.field_2._M_allocated_capacity = *psVar17;
      local_3c8.field_2._8_8_ = plVar14[3];
    }
    else {
      local_3c8.field_2._M_allocated_capacity = *psVar17;
      local_3c8._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_3c8._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_3c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8);
    }
    if (local_3e8 != (char *)&local_3d8) {
      operator_delete(local_3e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if (local_328 != local_318) {
      operator_delete(local_328);
    }
    for (uVar26 = 0;
        sVar8 = QueryCompiler::numberOfViews
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), uVar26 < sVar8; uVar26 = uVar26 + 1) {
      uVar15 = uVar26 + 0x3f;
      if (-1 < (long)uVar26) {
        uVar15 = uVar26;
      }
      if ((*(ulong *)(local_230._0_8_ +
                     (((long)uVar15 >> 6) +
                     ((ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
           (uVar26 & 0x3f) & 1) != 0) {
        cVar25 = '\x01';
        if (9 < uVar26) {
          uVar15 = uVar26;
          cVar6 = '\x04';
          do {
            cVar25 = cVar6;
            if (uVar15 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_002973f9;
            }
            if (uVar15 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_002973f9;
            }
            if (uVar15 < 10000) goto LAB_002973f9;
            bVar7 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar6 = cVar25 + '\x04';
          } while (bVar7);
          cVar25 = cVar25 + '\x01';
        }
LAB_002973f9:
        local_3e8 = (char *)&local_3d8;
        std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_3e8,(uint)local_3e0,uVar26);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x2b1a82);
        local_3a8 = &local_398;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_398 = *plVar14;
          lStack_390 = puVar13[3];
        }
        else {
          local_398 = *plVar14;
          local_3a8 = (long *)*puVar13;
        }
        local_3a0 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        psVar17 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_3c8.field_2._M_allocated_capacity = *psVar17;
          local_3c8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_3c8.field_2._M_allocated_capacity = *psVar17;
          local_3c8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_3c8._M_string_length = puVar13[1];
        *puVar13 = psVar17;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_3c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
        if (local_3e8 != (char *)&local_3d8) {
          operator_delete(local_3e8);
        }
      }
    }
    if (local_2a0._M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::operator+(&local_3c8,"\nGROUP BY ",&local_2a0);
      std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_3c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::append((char *)&local_270);
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if ((_Bit_type *)local_230._0_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_230._0_8_);
    }
    local_308 = local_308 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateLmfaoQuery()
{
    string returnString = "";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* v = _qc->getView(viewID);
        TDNode* node = _td->getRelation(v->_origin);

        size_t numberIncomingViews =
            (v->_origin == v->_destination ? node->_numOfNeighbors :
             node->_numOfNeighbors - 1);
        
        vector<bool> viewBitset(_qc->numberOfViews());

        string fvars = ""; 
        for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
            if (v->_fVars.test(i))
                fvars +=  _td->getAttribute(i)->_name + ",";
       
        string aggregateString = "";
        for (size_t aggNo = 0; aggNo < v->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = v->_aggregates[aggNo];

            string agg = "";
            size_t incomingCounter = 0;
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                string localAgg = "";
                const prod_bitset& product = aggregate->_agg[i];
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {  
                    if (product.test(f))
                        localAgg += getFunctionString(f)+"*";
                }

                agg += localAgg;
                
                string viewAgg = "";
                for (size_t n = 0; n < numberIncomingViews; ++n)
                {
                    std::pair<size_t,size_t> viewAggID =
                        aggregate->_incoming[incomingCounter];
                    
                    viewAgg += "agg_"+to_string(viewAggID.first)+"_"+
                        to_string(viewAggID.second)+"*";
                    viewBitset[viewAggID.first] = 1;
                    ++incomingCounter;
                }

                agg += viewAgg;

                if (!agg.empty())
                {
                    agg.pop_back();
                    agg += "+";
                }              
            }

            if (agg.empty())
                agg = "1";
            else
                agg.pop_back();

            aggregateString += "\nSUM("+agg+") AS agg_"+to_string(viewID)+
                "_"+to_string(aggNo)+",";
        }

        aggregateString.pop_back();

        
        returnString += "CREATE TABLE view_"+to_string(viewID)+" AS\nSELECT "+fvars+
            aggregateString+"\nFROM "+_td->getRelation(v->_origin)->_name+" ";
        for (size_t id = 0; id < _qc->numberOfViews(); ++id)
            if (viewBitset[id])
                returnString += "NATURAL JOIN view_"+to_string(id)+" ";

        if (!fvars.empty())
        {
            fvars.pop_back();
            returnString += "\nGROUP BY "+fvars;
        }
        
        returnString += ";\n\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao.sql", std::ofstream::out);
    ofs << returnString;
    ofs.close();
    // DINFO(returnString);   
}